

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O0

string * hashStr_abi_cxx11_(string *__return_storage_ptr__,uint32_t param_1)

{
  reference pvVar1;
  string local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  allocator<char> local_16;
  undefined1 local_15;
  uint32_t local_14;
  string *psStack_10;
  uint32_t param_0_local;
  string *str;
  
  local_15 = 0;
  local_14 = param_1;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "    static inline constexpr uint32_t hash(uint32_t a) noexcept{\n",&local_16);
  std::allocator<char>::~allocator(&local_16);
  pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,0);
  if ((*pvVar1 == 0) || (pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,1), *pvVar1 == 0)) {
    pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,0);
    if (*pvVar1 == 0) {
      pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,1);
      if (*pvVar1 != 0) {
        pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,1);
        std::__cxx11::to_string(&local_1a8,*pvVar1);
        std::operator+(&local_188,"        a ^= a >> ",&local_1a8);
        std::operator+(&local_168,&local_188,";\n");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
    }
    else {
      pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,0);
      std::__cxx11::to_string(&local_148,*pvVar1);
      std::operator+(&local_128,"        a ^= a ^ ",&local_148);
      std::operator+(&local_108,&local_128,";\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
    }
  }
  else {
    pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,0);
    std::__cxx11::to_string(&local_c8,*pvVar1);
    std::operator+(&local_a8,"        a =  (a ^ ",&local_c8);
    std::operator+(&local_88,&local_a8,") ^ (a >> ");
    pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,1);
    std::__cxx11::to_string(&local_e8,*pvVar1);
    std::operator+(&local_68,&local_88,&local_e8);
    std::operator+(&local_48,&local_68,");\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,2);
  if (*pvVar1 != 0) {
    pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,2);
    std::__cxx11::to_string(&local_208,*pvVar1);
    std::operator+(&local_1e8,"        a += a << ",&local_208);
    std::operator+(&local_1c8,&local_1e8,";\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
  }
  pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,3);
  if (*pvVar1 != 0) {
    pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,3);
    std::__cxx11::to_string(&local_268,*pvVar1);
    std::operator+(&local_248,"        a ^= a >> ",&local_268);
    std::operator+(&local_228,&local_248,";\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
  }
  pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,4);
  if (*pvVar1 != 0) {
    pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,4);
    std::__cxx11::to_string(&local_2c8,*pvVar1 + 1);
    std::operator+(&local_2a8,"        a *= ",&local_2c8);
    std::operator+(&local_288,&local_2a8,";\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
  }
  pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,5);
  if (*pvVar1 != 0) {
    pvVar1 = std::array<unsigned_int,_6UL>::operator[](&c,5);
    std::__cxx11::to_string(&local_328,*pvVar1);
    std::operator+(&local_308,"        a ^= a >> ",&local_328);
    std::operator+(&local_2e8,&local_308,";\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"        return a;\n    }\n");
  return __return_storage_ptr__;
}

Assistant:

std::string hashStr(uint32_t){
    std::string str =
"    static inline constexpr uint32_t hash(uint32_t a) noexcept{\n";
    if(c[0] && c[1])
        str += "        a =  (a ^ " + std::to_string(c[0]) + ") ^ (a >> " + std::to_string(c[1]) + ");\n";
    else if(c[0])
        str += "        a ^= a ^ " + std::to_string(c[0]) + ";\n";
    else if(c[1])
        str += "        a ^= a >> " + std::to_string(c[1]) + ";\n";

    if(c[2]) str += "        a += a << " + std::to_string(c[2]) + ";\n";
    if(c[3]) str += "        a ^= a >> " + std::to_string(c[3]) + ";\n";
    if(c[4]) str += "        a *= " + std::to_string(c[4]+1) + ";\n";
    if(c[5]) str += "        a ^= a >> " + std::to_string(c[5]) + ";\n";

    str += "        return a;\n"
           "    }\n";

    return str;
}